

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurvesTests.cpp
# Opt level: O1

void __thiscall
agge::tests::QuadraticBezierCurveTests::CoarseQBezier2ProducesLine(QuadraticBezierCurveTests *this)

{
  qbezier b2;
  qbezier b1;
  undefined1 local_170 [8];
  undefined4 local_168;
  char local_160 [24];
  point local_148;
  undefined8 local_13c;
  undefined4 local_134;
  undefined8 local_130;
  undefined4 local_128;
  pointer local_118;
  int local_110;
  pointer local_10c;
  int local_104;
  char *local_100;
  int local_f8;
  point local_e8;
  undefined8 local_dc;
  undefined4 local_d4;
  undefined8 local_d0;
  undefined4 local_c8;
  pointer local_b8;
  int local_b0;
  pointer local_ac;
  int local_a4;
  char *local_a0;
  int local_98;
  real_t *local_90 [2];
  real_t local_80 [6];
  string local_68;
  qbezier local_44;
  
  qbezier::qbezier(&local_44,0.0,0.0,1.0,1.0,2.0,0.0,100.0);
  local_168 = 0;
  local_170 = (undefined1  [8])0x0;
  local_b0 = qbezier::vertex(&local_44,(real_t *)local_170,(real_t *)(local_170 + 4));
  local_b8 = (pointer)local_170;
  local_168 = 0;
  local_170 = (undefined1  [8])0x0;
  local_a4 = qbezier::vertex(&local_44,(real_t *)local_170,(real_t *)(local_170 + 4));
  local_ac = (pointer)local_170;
  local_168 = 0;
  local_170 = (undefined1  [8])0x0;
  local_98 = qbezier::vertex(&local_44,(real_t *)local_170,(real_t *)(local_170 + 4));
  local_a0 = (char *)local_170;
  local_e8.x = 0.0;
  local_e8.y = 0.0;
  local_e8.command = 1;
  local_dc = 0x40000000;
  local_d4 = 2;
  local_d0 = 0;
  local_c8 = 0;
  local_90[0] = &((qbezier *)local_90)->_xe;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_170,(string *)local_90,0x2e);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,3ul>
            ((point (*) [3])&local_e8,(point (*) [3])&local_b8,(LocationInfo *)local_170);
  if (local_170 != (undefined1  [8])local_160) {
    operator_delete((void *)local_170);
  }
  if (local_90[0] != &((qbezier *)local_90)->_xe) {
    operator_delete(local_90[0]);
  }
  qbezier::qbezier((qbezier *)local_90,10.0,11.0,1.0,1.0,13.0,17.0,100.0);
  local_168 = 0;
  local_170 = (undefined1  [8])0x0;
  local_110 = qbezier::vertex((qbezier *)local_90,(real_t *)local_170,(real_t *)(local_170 + 4));
  local_118 = (pointer)local_170;
  local_168 = 0;
  local_170 = (undefined1  [8])0x0;
  local_104 = qbezier::vertex((qbezier *)local_90,(real_t *)local_170,(real_t *)(local_170 + 4));
  local_10c = (pointer)local_170;
  local_168 = 0;
  local_170 = (undefined1  [8])0x0;
  local_f8 = qbezier::vertex((qbezier *)local_90,(real_t *)local_170,(real_t *)(local_170 + 4));
  local_100 = (char *)local_170;
  local_148.x = 10.0;
  local_148.y = 11.0;
  local_148.command = 1;
  local_13c = 0x4188000041500000;
  local_134 = 2;
  local_130 = 0;
  local_128 = 0;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_170,&local_68,0x39);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,3ul>
            ((point (*) [3])&local_148,(point (*) [3])&local_118,(LocationInfo *)local_170);
  if (local_170 != (undefined1  [8])local_160) {
    operator_delete((void *)local_170);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

test( CoarseQBezier2ProducesLine )
			{
				// INIT
				qbezier b1(0.0f, 0.0f, 1.0f, 1.0f, 2.0f, 0.0f, 100.0f /* ridiculously big step */);

				// ACT
				mocks::path::point points1[] = { vertex(b1), vertex(b1), vertex(b1), };

				// ASSERT
				mocks::path::point reference1[] = { moveto(0.0f, 0.0f), lineto(2.0f, 0.0f), stop(), };

				assert_equal(reference1, points1);

				// INIT
				qbezier b2(10.0f, 11.0f, 1.0f, 1.0f, 13.0f, 17.0f, 100.0f /* ridiculously big step */);

				// ACT
				mocks::path::point points2[] = { vertex(b2), vertex(b2), vertex(b2), };

				// ASSERT
				mocks::path::point reference2[] = { moveto(10.0f, 11.0f), lineto(13.0f, 17.0f), stop(), };

				assert_equal(reference2, points2);
			}